

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_enable_universal_pdgcode(mcpl_outfile_t of,int32_t pdgcode)

{
  if (pdgcode == 0) {
    mcpl_error("mcpl_enable_universal_pdgcode must be called with non-zero pdgcode.");
  }
  if (*(int *)((long)of.internal + 0x54) != 0) {
    if (*(int *)((long)of.internal + 0x54) == pdgcode) {
      return;
    }
    mcpl_error("mcpl_enable_universal_pdgcode called multiple times");
  }
  if (*(int *)((long)of.internal + 0x60) != 0) {
    *(int32_t *)((long)of.internal + 0x54) = pdgcode;
    mcpl_recalc_psize(of);
    return;
  }
  mcpl_error("mcpl_enable_universal_pdgcode called too late.");
}

Assistant:

void mcpl_enable_universal_pdgcode(mcpl_outfile_t of, int32_t pdgcode)
{
  MCPLIMP_OUTFILEDECODE;
  if (pdgcode==0)
    mcpl_error("mcpl_enable_universal_pdgcode must be called with non-zero pdgcode.");
  if (f->opt_universalpdgcode) {
    if (f->opt_universalpdgcode!=pdgcode)
      mcpl_error("mcpl_enable_universal_pdgcode called multiple times");
    return;
  }
  if (!f->header_notwritten)
    mcpl_error("mcpl_enable_universal_pdgcode called too late.");
  f->opt_universalpdgcode = pdgcode;
  mcpl_recalc_psize(of);
}